

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::updateEditorData
          (QAbstractItemViewPrivate *this,QModelIndex *tl,QModelIndex *br)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long *plVar5;
  QAbstractItemModel *pQVar6;
  Span *pSVar7;
  Entry *pEVar8;
  int iVar9;
  long *plVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  Data *pDVar15;
  long in_FS_OFFSET;
  bool bVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  QIndexEditorHash indexEditorHashCopy;
  undefined8 local_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QHash<QPersistentModelIndex,_QEditorInfo> local_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar16 = false;
  if ((((-1 < tl->r) && (-1 < tl->c)) && ((tl->m).ptr != (QAbstractItemModel *)0x0)) &&
     ((bVar16 = false, -1 < br->r && (-1 < br->c)))) {
    bVar16 = (br->m).ptr != (QAbstractItemModel *)0x0;
  }
  plVar5 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = (tl->m).ptr;
  if (pQVar6 == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar6 + 0x68))(&local_58,pQVar6,tl);
  }
  local_60.d = (this->indexEditorHash).d;
  if ((local_60.d != (Data *)0x0) &&
     (((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_60.d == (Data *)0x0) {
    pDVar15 = (Data *)0x0;
  }
  else {
    pDVar15 = local_60.d;
    if ((local_60.d)->spans->offsets[0] == 0xff) {
      uVar11 = 1;
      do {
        uVar14 = uVar11;
        if ((local_60.d)->numBuckets == uVar14) {
          uVar14 = 0;
          pDVar15 = (Data *)0x0;
          break;
        }
        uVar11 = uVar14 + 1;
      } while ((local_60.d)->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f] == 0xff);
      goto LAB_0054178d;
    }
  }
  uVar14 = 0;
LAB_0054178d:
  if (uVar14 != 0 || pDVar15 != (Data *)0x0) {
    do {
      pSVar7 = pDVar15->spans;
      uVar11 = uVar14 >> 7;
      uVar12 = (uint)uVar14 & 0x7f;
      lVar13 = *(long *)(pSVar7[uVar11].entries[pSVar7[uVar11].offsets[uVar12]].storage.data + 8);
      if ((lVar13 == 0) || (*(int *)(lVar13 + 4) == 0)) {
        lVar13 = 0;
      }
      else {
        lVar13 = *(long *)(pSVar7[uVar11].entries[pSVar7[uVar11].offsets[uVar12]].storage.data +
                          0x10);
      }
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_78,
                 (QPersistentModelIndex *)(pSVar7[uVar11].entries + pSVar7[uVar11].offsets[uVar12]))
      ;
      if ((lVar13 != 0) &&
         (pEVar8 = pDVar15->spans[uVar11].entries,
         pEVar8[pDVar15->spans[uVar11].offsets[uVar12]].storage.data[0x18] == '\0')) {
        iVar9 = (int)local_78;
        iVar18 = (int)((ulong)local_78 >> 0x20);
        auVar19._0_4_ = -(uint)(-1 < iVar9);
        auVar19._4_4_ = -(uint)(-1 < iVar9);
        auVar19._8_4_ = -(uint)(-1 < (long)local_78);
        auVar19._12_4_ = -(uint)(-1 < (long)local_78);
        uVar12 = movmskpd((int)pEVar8,auVar19);
        if (((uVar12 & 1) != 0) &&
           (((byte)((byte)uVar12 >> 1) != 0 && (local_68.ptr != (QAbstractItemModel *)0x0)))) {
          if (bVar16) {
            uVar1 = tl->r;
            uVar3 = tl->c;
            uVar2 = br->r;
            uVar4 = br->c;
            auVar17._0_4_ = -(uint)((int)uVar2 < iVar9);
            auVar17._4_4_ = -(uint)((int)uVar4 < iVar18);
            auVar17._8_4_ = -(uint)(iVar9 < (int)uVar1);
            auVar17._12_4_ = -(uint)(iVar18 < (int)uVar3);
            iVar9 = movmskps((int)br,auVar17);
            if (iVar9 == 0) {
              if (local_68.ptr == (QAbstractItemModel *)0x0) {
                local_90 = 0xffffffffffffffff;
                local_88 = (undefined1 *)0x0;
                puStack_80 = (undefined1 *)0x0;
              }
              else {
                (**(code **)(*(long *)local_68.ptr + 0x68))
                          (&local_90,local_68.ptr,(QModelIndex *)&local_78);
              }
              if ((int)local_90 == (int)local_58) {
                if (((local_90._4_4_ == local_58._4_4_) && (local_88 == puStack_50)) &&
                   (puStack_80 == local_48)) goto LAB_00541905;
              }
            }
          }
          else {
LAB_00541905:
            plVar10 = (long *)(**(code **)(*plVar5 + 0x208))(plVar5,(QModelIndex *)&local_78);
            if (plVar10 != (long *)0x0) {
              (**(code **)(*plVar10 + 0x80))(plVar10,lVar13,(QModelIndex *)&local_78);
            }
          }
        }
      }
      do {
        if (pDVar15->numBuckets - 1 == uVar14) {
          uVar14 = 0;
          pDVar15 = (Data *)0x0;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (pDVar15->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f] == 0xff);
    } while ((uVar14 != 0) || (pDVar15 != (Data *)0x0));
  }
  QHash<QPersistentModelIndex,_QEditorInfo>::~QHash(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::updateEditorData(const QModelIndex &tl, const QModelIndex &br)
{
    Q_Q(QAbstractItemView);
    // we are counting on having relatively few editors
    const bool checkIndexes = tl.isValid() && br.isValid();
    const QModelIndex parent = tl.parent();
    // QTBUG-25370: We need to copy the indexEditorHash, because while we're
    // iterating over it, we are calling methods which can allow user code to
    // call a method on *this which can modify the member indexEditorHash.
    const QIndexEditorHash indexEditorHashCopy = indexEditorHash;
    QIndexEditorHash::const_iterator it = indexEditorHashCopy.constBegin();
    for (; it != indexEditorHashCopy.constEnd(); ++it) {
        QWidget *editor = it.value().widget.data();
        const QModelIndex index = it.key();
        if (it.value().isStatic || !editor || !index.isValid() ||
            (checkIndexes
                && (index.row() < tl.row() || index.row() > br.row()
                    || index.column() < tl.column() || index.column() > br.column()
                    || index.parent() != parent)))
            continue;

        QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        if (delegate) {
            delegate->setEditorData(editor, index);
        }
    }
}